

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

XpubDataStruct * __thiscall
cfd::api::json::XpubData::ConvertToStruct(XpubDataStruct *__return_storage_ptr__,XpubData *this)

{
  XpubDataStruct::XpubDataStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->hex);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

XpubDataStruct XpubData::ConvertToStruct() const {  // NOLINT
  XpubDataStruct result;
  result.base58 = base58_;
  result.hex = hex_;
  result.ignore_items = ignore_items;
  return result;
}